

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::df_solver_t::updateU
          (df_solver_t *this,clock_id_t i,clock_id_t j,ineq_cmp_t cmp,integer_t value)

{
  bool bVar1;
  db_t local_24;
  integer_t local_20;
  db_t bound;
  integer_t value_local;
  ineq_cmp_t cmp_local;
  clock_id_t j_local;
  clock_id_t i_local;
  df_solver_t *this_local;
  
  local_20 = value;
  bound = (db_t)cmp;
  if (this->_dim <= (ulong)i) {
    __assert_fail("i < _dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xf0,
                  "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  if (this->_dim <= (ulong)j) {
    __assert_fail("j < _dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xf1,
                  "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  local_24 = tchecker::dbm::db(cmp,value);
  bVar1 = tchecker::dbm::operator<(&local_24,this->_U + (ulong)i * this->_dim + (ulong)j);
  if (bVar1) {
    this->_U[(ulong)i * this->_dim + (ulong)j] = local_24;
    this->_updated_U = true;
  }
  return;
}

Assistant:

void df_solver_t::updateU(tchecker::clock_id_t i, tchecker::clock_id_t j, tchecker::ineq_cmp_t cmp, tchecker::integer_t value)
{
  assert(i < _dim);
  assert(j < _dim);
  tchecker::dbm::db_t bound = tchecker::dbm::db(cmp, value);
  if (bound < _U[i * _dim + j]) {
    _U[i * _dim + j] = bound;
    _updated_U = true;
  }
}